

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

double * __thiscall
google::protobuf::Map<long,_double>::at<long>(Map<long,_double> *this,key_arg<long> *key)

{
  LogMessage *pLVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  InnerMap::FindHelper<long>
            ((pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<const_google::protobuf::MapPair<long,_double>_>,_unsigned_long>
              *)&local_50,&this->elements_,key,(TreeIterator *)0x0);
  if (local_50._0_8_ == 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x4cb);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: it != end(): ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"key not found: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,*key);
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (double *)(local_50._0_8_ + 8);
}

Assistant:

const T& at(const key_arg<K>& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }